

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *this_00;
  bool bVar3;
  Value *pVVar4;
  string *psVar5;
  pointer path;
  pointer pbVar6;
  string tdin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked;
  Value local_430;
  Value local_408;
  Value local_3e0;
  Value local_3b8;
  Value local_390;
  Value local_368;
  Value local_340;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  cmGeneratedFileStream tdif;
  
  Json::Value::Value(&tdi,objectValue);
  Json::Value::Value(&local_2a0,lang);
  pVVar4 = Json::Value::operator[](&tdi,"language");
  Json::Value::operator=(pVVar4,&local_2a0);
  Json::Value::~Value(&local_2a0);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&tdin,"CMAKE_",lang);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tdif,&tdin,
                 "_COMPILER_ID");
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&tdif);
  Json::Value::Value(&local_2c8,psVar5);
  pVVar4 = Json::Value::operator[](&tdi,"compiler-id");
  Json::Value::operator=(pVVar4,&local_2c8);
  Json::Value::~Value(&local_2c8);
  std::__cxx11::string::~string((string *)&tdif);
  std::__cxx11::string::~string((string *)&tdin);
  bVar3 = std::operator==(lang,"Fortran");
  if (bVar3) {
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&tdif,pcVar2,psVar5);
    if (tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ == 0) {
      cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                ((this->super_cmCommonTargetGenerator).Makefile);
      std::__cxx11::string::_M_assign((string *)&tdif);
    }
    Json::Value::Value(&local_2f0,(string *)&tdif);
    pVVar4 = Json::Value::operator[](&tdi,"module-dir");
    Json::Value::operator=(pVVar4,&local_2f0);
    Json::Value::~Value(&local_2f0);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_SEP",(allocator<char> *)&includes);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&tdin);
    Json::Value::Value(&local_318,psVar5);
    pVVar4 = Json::Value::operator[](&tdi,"submodule-sep");
    Json::Value::operator=(pVVar4,&local_318);
    Json::Value::~Value(&local_318);
    std::__cxx11::string::~string((string *)&tdin);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tdin,"CMAKE_Fortran_SUBMODULE_EXT",(allocator<char> *)&includes);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&tdin);
    Json::Value::Value(&local_340,psVar5);
    pVVar4 = Json::Value::operator[](&tdi,"submodule-ext");
    Json::Value::operator=(pVVar4,&local_340);
    Json::Value::~Value(&local_340);
    std::__cxx11::string::~string((string *)&tdin);
    std::__cxx11::string::~string((string *)&tdif);
  }
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_368,psVar5);
  pVVar4 = Json::Value::operator[](&tdi,"dir-cur-bld");
  Json::Value::operator=(pVVar4,&local_368);
  Json::Value::~Value(&local_368);
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_390,psVar5);
  pVVar4 = Json::Value::operator[](&tdi,"dir-cur-src");
  Json::Value::operator=(pVVar4,&local_390);
  Json::Value::~Value(&local_390);
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_3b8,psVar5);
  pVVar4 = Json::Value::operator[](&tdi,"dir-top-bld");
  Json::Value::operator=(pVVar4,&local_3b8);
  Json::Value::~Value(&local_3b8);
  psVar5 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_3e0,psVar5);
  pVVar4 = Json::Value::operator[](&tdi,"dir-top-src");
  Json::Value::operator=(pVVar4,&local_3e0);
  Json::Value::~Value(&local_3e0);
  Json::Value::Value(&local_408,arrayValue);
  pVVar4 = Json::Value::operator[](&tdi,"include-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,&local_408);
  Json::Value::~Value(&local_408);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_00 = this->LocalGenerator;
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories((cmLocalGenerator *)this_00,&includes,pcVar2,lang,psVar5);
  pbVar6 = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (path = includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; path != pbVar6; path = path + 1) {
    ConvertToNinjaPath(&tdin,this,path);
    Json::Value::Value((Value *)&tdif,&tdin);
    Json::Value::append(pVVar4,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    std::__cxx11::string::~string((string *)&tdin);
  }
  Json::Value::Value(&local_430,arrayValue);
  pVVar4 = Json::Value::operator[](&tdi,"linked-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,&local_430);
  Json::Value::~Value(&local_430);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            (&linked,&this->super_cmCommonTargetGenerator);
  for (pbVar6 = linked.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != linked.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    Json::Value::Value((Value *)&tdif,pbVar6);
    Json::Value::append(pVVar4,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  GetTargetDependInfoPath(&tdin,this,lang);
  cmGeneratedFileStream::cmGeneratedFileStream(&tdif,&tdin,false,None);
  Json::operator<<((ostream *)&tdif,&tdi);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tdif);
  std::__cxx11::string::~string((string *)&tdin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linked);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  Json::Value::~Value(&tdi);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  std::vector<std::string> linked = this->GetLinkedTargetDirectories();
  for (std::string const& l : linked) {
    tdi_linked_target_dirs.append(l);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}